

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int find_odc_header(archive_read *a)

{
  int iVar1;
  size_t local_48;
  ssize_t bytes;
  size_t skipped;
  size_t skip;
  char *q;
  char *p;
  void *h;
  archive_read *a_local;
  
  bytes = 0;
  h = a;
  while( true ) {
    q = (char *)__archive_read_ahead((archive_read *)h,0x4c,(ssize_t *)&local_48);
    if (q == (char *)0x0) {
      return -0x1e;
    }
    skip = (size_t)(q + local_48);
    p = q;
    iVar1 = memcmp("070707",q,6);
    if ((iVar1 == 0) && (iVar1 = is_octal(q,0x4c), iVar1 != 0)) break;
    iVar1 = memcmp("070727",q,6);
    if ((iVar1 == 0) && (iVar1 = is_afio_large(q,local_48), iVar1 != 0)) {
      *(undefined4 *)((long)h + 0x10) = 0x10006;
      return 0;
    }
    while (q + 0x4c <= skip) {
      if (q[5] == '0') {
        q = q + 1;
      }
      else if (q[5] == '7') {
        iVar1 = memcmp("070707",q,6);
        if (((iVar1 == 0) && (iVar1 = is_octal(q,0x4c), iVar1 != 0)) ||
           ((iVar1 = memcmp("070727",q,6), iVar1 == 0 &&
            (iVar1 = is_afio_large(q,skip - (long)q), iVar1 != 0)))) {
          skipped = (long)q - (long)p;
          __archive_read_consume((archive_read *)h,skipped);
          bytes = skipped + bytes;
          if (q[4] == '2') {
            *(undefined4 *)((long)h + 0x10) = 0x10006;
          }
          if (bytes != 0) {
            archive_set_error((archive *)h,0,"Skipped %d bytes before finding valid header",
                              bytes & 0xffffffff);
            return -0x14;
          }
          return 0;
        }
        q = q + 2;
      }
      else {
        q = q + 6;
      }
    }
    skipped = (long)q - (long)p;
    __archive_read_consume((archive_read *)h,skipped);
    bytes = skipped + bytes;
  }
  return 0;
}

Assistant:

static int
find_odc_header(struct archive_read *a)
{
	const void *h;
	const char *p, *q;
	size_t skip, skipped = 0;
	ssize_t bytes;

	for (;;) {
		h = __archive_read_ahead(a, odc_header_size, &bytes);
		if (h == NULL)
			return (ARCHIVE_FATAL);
		p = h;
		q = p + bytes;

		/* Try the typical case first, then go into the slow search.*/
		if (memcmp("070707", p, 6) == 0 && is_octal(p, odc_header_size))
			return (ARCHIVE_OK);
		if (memcmp("070727", p, 6) == 0 && is_afio_large(p, bytes)) {
			a->archive.archive_format = ARCHIVE_FORMAT_CPIO_AFIO_LARGE;
			return (ARCHIVE_OK);
		}

		/*
		 * Scan ahead until we find something that looks
		 * like an odc header.
		 */
		while (p + odc_header_size <= q) {
			switch (p[5]) {
			case '7':
				if ((memcmp("070707", p, 6) == 0
				    && is_octal(p, odc_header_size))
				    || (memcmp("070727", p, 6) == 0
				        && is_afio_large(p, q - p))) {
					skip = p - (const char *)h;
					__archive_read_consume(a, skip);
					skipped += skip;
					if (p[4] == '2')
						a->archive.archive_format =
						    ARCHIVE_FORMAT_CPIO_AFIO_LARGE;
					if (skipped > 0) {
						archive_set_error(&a->archive,
						    0,
						    "Skipped %d bytes before "
						    "finding valid header",
						    (int)skipped);
						return (ARCHIVE_WARN);
					}
					return (ARCHIVE_OK);
				}
				p += 2;
				break;
			case '0':
				p++;
				break;
			default:
				p += 6;
				break;
			}
		}
		skip = p - (const char *)h;
		__archive_read_consume(a, skip);
		skipped += skip;
	}
}